

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention_x86_avx512::create_pipeline
          (MultiHeadAttention_x86_avx512 *this,Option *opt)

{
  _func_int *p_Var1;
  int *piVar2;
  void *pvVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  Layer *pLVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 in_ZMM0 [64];
  ParamDict pd;
  Option opt1;
  undefined8 uStack_118;
  undefined8 auStack_10c [2];
  undefined8 uStack_f8;
  undefined1 auStack_f0 [8];
  undefined1 auStack_ec [8];
  undefined8 uStack_e4;
  Mat local_d8;
  void *local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  long *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_48;
  float local_34;
  undefined4 uVar9;
  undefined3 uVar11;
  undefined2 uVar13;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  
  auVar26._0_4_ =
       (float)(*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]) /
              *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auVar26._4_12_ = in_ZMM0._4_12_;
  auVar5 = vrsqrtss_avx(auVar26,auVar26);
  auVar26 = vfmadd213ss_fma(ZEXT416((uint)(auVar26._0_4_ * auVar5._0_4_)),auVar5,ZEXT416(0xc0400000)
                           );
  local_34 = auVar5._0_4_ * -0.5 * auVar26._0_4_;
  auStack_f0 = (undefined1  [8])0x51e3cb;
  pLVar24 = create_layer(0x4a);
  this->q_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x51e3da;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51e3ed;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0,local_34);
  auStack_f0 = (undefined1  [8])0x51e402;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),1,1.0);
  auStack_f0 = (undefined1  [8])0x51e411;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x51e423;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51e435;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x51e444;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51e456;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51e471;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auStack_f0 = (undefined1  [8])0x51e480;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51e49b;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auStack_f0 = (undefined1  [8])0x51e4ad;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x51e4bc;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51e4ce;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51e4dd;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x51e4ea;
  (*this->q_gemm->_vptr_Layer[2])(this->q_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar25 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar25) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar25) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar25) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar25) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar25) = 0;
    lVar25 = lVar25 + 0x48;
  } while (lVar25 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
  if (&local_d8 != (Mat *)(&this->field_0xe8 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0xf0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51e584;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51e575;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0xe8 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf0 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf0 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf8 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf8 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x100 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x108 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x110 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var1);
    local_d8._60_4_ = local_d8._60_4_;
    local_d8.c = *(int *)(&this->field_0x120 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x128 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
  if (&local_90 != (void **)(&this->field_0x130 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51e667;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51e658;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x130 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x138 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x138 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x140 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x140 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x148 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x150 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x158 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x160 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x168 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x170 + (long)p_Var1);
  }
  pLVar24 = this->q_gemm;
  auStack_f0 = (undefined1  [8])0x51e711;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x51e723;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_48);
  auStack_f0 = (undefined1  [8])0x51e730;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x51e73d;
  (*this->q_gemm->_vptr_Layer[4])(this->q_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
    piVar2 = *(int **)(&this->field_0xf0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x108 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0xe8 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51e78e;
            free(*(void **)(&this->field_0xe8 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51e77f;
          (**(code **)(**(long **)(&this->field_0x108 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x128 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xfc + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xf0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x118 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x120 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
    piVar2 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51e812;
            free(*(void **)(&this->field_0x130 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51e7ff;
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var1) = 0;
  }
  lVar25 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar25);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar25);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar25);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51e88c;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51e879;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar25) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar25) = 0;
    lVar25 = lVar25 + -0x48;
  } while (lVar25 != -0x48);
  auStack_f0 = (undefined1  [8])0x51e8c7;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51e8d1;
  pLVar24 = create_layer(0x4a);
  this->k_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x51e8e0;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51e8ef;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x51e901;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51e913;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x51e922;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51e934;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51e94f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auStack_f0 = (undefined1  [8])0x51e95e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51e979;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xdc + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auStack_f0 = (undefined1  [8])0x51e98b;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x51e99a;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51e9ac;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51e9bb;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x51e9c8;
  (*this->k_gemm->_vptr_Layer[2])(this->k_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar25 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar25) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar25) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar25) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar25) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar25) = 0;
    lVar25 = lVar25 + 0x48;
  } while (lVar25 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
  if (&local_d8 != (Mat *)(&this->field_0x178 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x180 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51ea5e;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51ea4f;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x178 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x180 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x180 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x188 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x188 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x190 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x198 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1);
    local_d8._60_4_ = local_d8._60_4_;
    local_d8.c = *(int *)(&this->field_0x1b0 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x1b8 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
  if (&local_90 != (void **)(&this->field_0x1c0 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x1c8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51eb43;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51eb34;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x1c0 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x1d8 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x1e0 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x1f0 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x1f8 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x200 + (long)p_Var1);
  }
  pLVar24 = this->k_gemm;
  auStack_f0 = (undefined1  [8])0x51ebed;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x51ebff;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_48);
  auStack_f0 = (undefined1  [8])0x51ec0c;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x51ec19;
  (*this->k_gemm->_vptr_Layer[4])(this->k_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
    piVar2 = *(int **)(&this->field_0x180 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x198 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x178 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51ec6a;
            free(*(void **)(&this->field_0x178 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51ec5b;
          (**(code **)(**(long **)(&this->field_0x198 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x18c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x1b0 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
    piVar2 = *(int **)(&this->field_0x1c8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x1e0 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x1c0 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51ecee;
            free(*(void **)(&this->field_0x1c0 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51ecdb;
          (**(code **)(**(long **)(&this->field_0x1e0 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x200 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1cc + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1d4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1c0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1c8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1e8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1f0 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x1f8 + (long)p_Var1) = 0;
  }
  lVar25 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar25);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar25);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar25);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51ed68;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51ed55;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar25) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar25) = 0;
    lVar25 = lVar25 + -0x48;
  } while (lVar25 != -0x48);
  auStack_f0 = (undefined1  [8])0x51eda3;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51edad;
  pLVar24 = create_layer(0x4a);
  this->v_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x51edbc;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51edcb;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x51eddd;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51edef;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x51edfe;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51ee10;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51ee2b;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auStack_f0 = (undefined1  [8])0x51ee3a;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51ee55;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xe0 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auStack_f0 = (undefined1  [8])0x51ee67;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x51ee76;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51ee88;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51ee97;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x51eea4;
  (*this->v_gemm->_vptr_Layer[2])(this->v_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar25 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar25) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar25) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar25) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar25) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar25) = 0;
    lVar25 = lVar25 + 0x48;
  } while (lVar25 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
  if (&local_d8 != (Mat *)(&this->field_0x208 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x210 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51ef3a;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51ef2b;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x208 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x210 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x210 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x218 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x218 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x220 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x228 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x230 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x238 + (long)p_Var1);
    local_d8._60_4_ = local_d8._60_4_;
    local_d8.c = *(int *)(&this->field_0x240 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x248 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
  if (&local_90 != (void **)(&this->field_0x250 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x258 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51f01f;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f010;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x250 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x258 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x258 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x260 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x260 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x268 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x270 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x278 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x280 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x288 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x290 + (long)p_Var1);
  }
  pLVar24 = this->v_gemm;
  auStack_f0 = (undefined1  [8])0x51f0c6;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x51f0d7;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_48);
  auStack_f0 = (undefined1  [8])0x51f0e4;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x51f0f1;
  (*this->v_gemm->_vptr_Layer[4])(this->v_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
    piVar2 = *(int **)(&this->field_0x210 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x228 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x208 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51f140;
            free(*(void **)(&this->field_0x208 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f131;
          (**(code **)(**(long **)(&this->field_0x228 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x248 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x214 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x21c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x208 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x210 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x230 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x238 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x240 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
    piVar2 = *(int **)(&this->field_0x258 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x270 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x250 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51f1bf;
            free(*(void **)(&this->field_0x250 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f1ac;
          (**(code **)(**(long **)(&this->field_0x270 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x290 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x25c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x264 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x250 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x258 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x278 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x280 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x288 + (long)p_Var1) = 0;
  }
  lVar25 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar25);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar25);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar25);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51f236;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f223;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar25) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar25) = 0;
    lVar25 = lVar25 + -0x48;
  } while (lVar25 != -0x48);
  auStack_f0 = (undefined1  [8])0x51f271;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51f27b;
  pLVar24 = create_layer(0x4a);
  this->qk_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x51f28a;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51f29c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,1);
  auStack_f0 = (undefined1  [8])0x51f2ab;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,0);
  auStack_f0 = (undefined1  [8])0x51f2ba;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x51f2c9;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51f2ea;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,
                 (uint)(*(int *)(&this->field_0xe4 +
                                (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]) == 0));
  auStack_f0 = (undefined1  [8])0x51f2f9;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x51f308;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51f319;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,0);
  auStack_f0 = (undefined1  [8])0x51f33c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,
                 -(uint)(*(int *)(&this->field_0xe4 +
                                 (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]) == 0) | 3);
  auStack_f0 = (undefined1  [8])0x51f34b;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51f35d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51f36a;
  (*this->qk_gemm->_vptr_Layer[2])();
  pLVar24 = this->qk_gemm;
  auStack_f0 = (undefined1  [8])0x51f37a;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8,(Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x51f388;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_d8);
  auStack_f0 = (undefined1  [8])0x51f395;
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8);
  uVar6._0_1_ = opt->lightmode;
  uVar6._1_3_ = *(undefined3 *)&opt->field_0x1;
  uVar6._4_4_ = opt->num_threads;
  uVar7 = opt->openmp_blocktime;
  uVar8 = opt->use_winograd_convolution;
  uVar10 = opt->use_sgemm_convolution;
  uVar12 = opt->use_int8_inference;
  uVar14 = opt->use_vulkan_compute;
  uVar13 = CONCAT11(uVar14,uVar12);
  uVar11 = CONCAT21(uVar13,uVar10);
  uVar9 = CONCAT31(uVar11,uVar8);
  local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
  local_d8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
  local_d8._48_8_ = *(undefined8 *)&opt->flush_denormals;
  local_d8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
  local_d8.refcount._0_4_ = SUB84(opt->blob_allocator,0);
  local_d8.refcount._4_4_ = (undefined4)((ulong)opt->blob_allocator >> 0x20);
  local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
  local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  local_d8.data._0_4_ = (undefined4)uVar6;
  local_d8.data = (void *)CONCAT44(1,local_d8.data._0_4_);
  auStack_f0 = (undefined1  [8])0x51f3bb;
  local_d8.elempack = uVar7;
  local_d8._28_4_ = uVar9;
  (*this->qk_gemm->_vptr_Layer[4])(this->qk_gemm,&local_d8);
  auStack_f0 = (undefined1  [8])0x51f3c3;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51f3cd;
  pLVar24 = create_layer(0x4a);
  this->qkv_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x51f3dc;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51f3eb;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x51f3fd;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51f40c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x51f41b;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51f42d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51f43c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x51f44b;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51f45a;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,0);
  auStack_f0 = (undefined1  [8])0x51f46c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,-1);
  auStack_f0 = (undefined1  [8])0x51f47b;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51f48d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51f49f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,1);
  auStack_f0 = (undefined1  [8])0x51f4ac;
  (*this->qkv_gemm->_vptr_Layer[2])();
  pLVar24 = this->qkv_gemm;
  auStack_f0 = (undefined1  [8])0x51f4bc;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8,(Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x51f4ca;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_d8);
  auStack_f0 = (undefined1  [8])0x51f4d7;
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8);
  uVar15._0_1_ = opt->lightmode;
  uVar15._1_3_ = *(undefined3 *)&opt->field_0x1;
  uVar15._4_4_ = opt->num_threads;
  uVar16 = opt->openmp_blocktime;
  uVar17 = opt->use_winograd_convolution;
  uVar19 = opt->use_sgemm_convolution;
  uVar21 = opt->use_int8_inference;
  uVar23 = opt->use_vulkan_compute;
  uVar22 = CONCAT11(uVar23,uVar21);
  uVar20 = CONCAT21(uVar22,uVar19);
  uVar18 = CONCAT31(uVar20,uVar17);
  local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
  local_d8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
  local_d8._48_8_ = *(undefined8 *)&opt->flush_denormals;
  local_d8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
  local_d8.refcount._0_4_ = SUB84(opt->blob_allocator,0);
  local_d8.refcount._4_4_ = (undefined4)((ulong)opt->blob_allocator >> 0x20);
  local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
  local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  local_d8.data._0_4_ = (undefined4)uVar15;
  local_d8.data = (void *)CONCAT44(1,local_d8.data._0_4_);
  auStack_f0 = (undefined1  [8])0x51f4fd;
  local_d8.elempack = uVar16;
  local_d8._28_4_ = uVar18;
  (*this->qkv_gemm->_vptr_Layer[4])();
  auStack_f0 = (undefined1  [8])0x51f505;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51f50f;
  pLVar24 = create_layer(0x20);
  this->qk_softmax = pLVar24;
  auStack_f0 = (undefined1  [8])0x51f520;
  ParamDict::ParamDict((ParamDict *)&local_d8);
  auStack_f0 = (undefined1  [8])0x51f52f;
  ParamDict::set((ParamDict *)&local_d8,0,-1);
  auStack_f0 = (undefined1  [8])0x51f543;
  ParamDict::set((ParamDict *)&local_d8,1,1);
  auStack_f0 = (undefined1  [8])0x51f552;
  (*this->qk_softmax->_vptr_Layer[2])();
  pLVar24 = this->qk_softmax;
  auStack_f0 = (undefined1  [8])0x51f560;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),
             (Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x51f56c;
  (*pLVar24->_vptr_Layer[3])(pLVar24,(undefined1 *)((long)register0x00000020 + -0xec) + 4);
  auStack_f0 = (undefined1  [8])0x51f574;
  ModelBinFromMatArray::~ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51f581;
  (*this->qk_softmax->_vptr_Layer[4])(this->qk_softmax,opt);
  auStack_f0 = (undefined1  [8])0x51f58e;
  ParamDict::~ParamDict((ParamDict *)&local_d8);
  auStack_f0 = (undefined1  [8])0x51f598;
  pLVar24 = create_layer(0x4a);
  this->o_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x51f5a7;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51f5b9;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,1);
  auStack_f0 = (undefined1  [8])0x51f5cb;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51f5da;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x51f5ec;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,1);
  auStack_f0 = (undefined1  [8])0x51f5fe;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51f60d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x51f628;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auStack_f0 = (undefined1  [8])0x51f643;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx512[-3]));
  auStack_f0 = (undefined1  [8])0x51f655;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,4);
  auStack_f0 = (undefined1  [8])0x51f664;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51f671;
  (*this->o_gemm->_vptr_Layer[2])(this->o_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar25 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar25) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar25) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar25) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar25) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar25) = 0;
    lVar25 = lVar25 + 0x48;
  } while (lVar25 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
  if (&local_d8 != (Mat *)(&this->field_0x298 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x2a0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51f707;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f6f8;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x298 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x2b0 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x2b8 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x2c0 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x2c8 + (long)p_Var1);
    local_d8._60_4_ = local_d8._60_4_;
    local_d8.c = *(int *)(&this->field_0x2d0 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x2d8 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
  if (&local_90 != (void **)(&this->field_0x2e0 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x2e8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51f7ec;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f7dd;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x2e0 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x2f8 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x300 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x308 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x310 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x318 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x320 + (long)p_Var1);
  }
  pLVar24 = this->o_gemm;
  auStack_f0 = (undefined1  [8])0x51f893;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x51f8a4;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_48);
  auStack_f0 = (undefined1  [8])0x51f8b1;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x51f8be;
  (*this->o_gemm->_vptr_Layer[4])(this->o_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
    piVar2 = *(int **)(&this->field_0x2a0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x2b8 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x298 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51f90d;
            free(*(void **)(&this->field_0x298 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f8fe;
          (**(code **)(**(long **)(&this->field_0x2b8 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x2d8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2a4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2ac + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x298 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2a0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2c0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2c8 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x2d0 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx512[-3];
    piVar2 = *(int **)(&this->field_0x2e8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x300 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x2e0 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51f98c;
            free(*(void **)(&this->field_0x2e0 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f979;
          (**(code **)(**(long **)(&this->field_0x300 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x320 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2ec + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2f4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2e0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2e8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x308 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x310 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x318 + (long)p_Var1) = 0;
  }
  lVar25 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar25);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar25);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar25);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51fa02;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51f9ef;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar25) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar25) = 0;
    lVar25 = lVar25 + -0x48;
  } while (lVar25 != -0x48);
  auStack_f0 = (undefined1  [8])0x51fa3d;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  return 0;
}

Assistant:

int MultiHeadAttention_x86_avx512::create_pipeline(const Option& opt)
{
    {
        const int embed_dim_per_head = embed_dim / num_heads;
        const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

        q_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, inv_sqrt_embed_dim_per_head);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, embed_dim); // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        q_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        k_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        v_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }
    {
        qkv_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    {
        qk_softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    {
        o_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, embed_dim); // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        o_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    return 0;
}